

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

void Saig_TsiStatePrint(Saig_Tsim_t *p,uint *pState)

{
  int iVar1;
  uint uVar2;
  uint local_2c;
  uint local_28;
  int nDcs;
  int nOnes;
  int nZeros;
  int Value;
  int i;
  uint *pState_local;
  Saig_Tsim_t *p_local;
  
  nDcs = 0;
  local_28 = 0;
  local_2c = 0;
  nZeros = 0;
  do {
    iVar1 = Aig_ManRegNum(p->pAig);
    if (iVar1 <= nZeros) {
      printf(" (0=%5d, 1=%5d, x=%5d)\n",(ulong)(uint)nDcs,(ulong)local_28,(ulong)local_2c);
      return;
    }
    iVar1 = Abc_InfoHasBit(pState,nZeros * 2 + 1);
    uVar2 = Abc_InfoHasBit(pState,nZeros << 1);
    uVar2 = iVar1 << 1 | uVar2;
    if (uVar2 == 1) {
      printf("0");
      nDcs = nDcs + 1;
    }
    else if (uVar2 == 2) {
      printf("1");
      local_28 = local_28 + 1;
    }
    else {
      if (uVar2 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                      ,0x1d5,"void Saig_TsiStatePrint(Saig_Tsim_t *, unsigned int *)");
      }
      printf("x");
      local_2c = local_2c + 1;
    }
    nZeros = nZeros + 1;
  } while( true );
}

Assistant:

void Saig_TsiStatePrint( Saig_Tsim_t * p, unsigned * pState )
{
    int i, Value, nZeros = 0, nOnes = 0, nDcs = 0;
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        if ( Value == SAIG_XVS0 )
            printf( "0" ), nZeros++;
        else if ( Value == SAIG_XVS1 )
            printf( "1" ), nOnes++;
        else if ( Value == SAIG_XVSX )
            printf( "x" ), nDcs++;
        else
            assert( 0 );
    }
    printf( " (0=%5d, 1=%5d, x=%5d)\n", nZeros, nOnes, nDcs );
}